

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O2

void icu_63::ByteSinkUtil::appendCodePoint(int32_t length,UChar32 c,ByteSink *sink,Edits *edits)

{
  ulong in_RAX;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uStack_18;
  char s8 [4];
  
  s8._1_3_ = (undefined3)(in_RAX >> 0x28);
  uStack_18 = (undefined4)in_RAX;
  if ((uint)c < 0x80) {
    _uStack_18 = CONCAT14((byte)c,uStack_18);
    uVar3 = 1;
  }
  else {
    if ((uint)c < 0x800) {
      _uStack_18 = CONCAT35(s8._1_3_,CONCAT14((char)((uint)c >> 6),uStack_18)) | 0xc000000000;
      uVar2 = 1;
    }
    else {
      if ((uint)c < 0x10000) {
        bVar1 = (byte)((uint)c >> 0xc) | 0xe0;
        uVar3 = 1;
        _uStack_18 = in_RAX;
      }
      else {
        bVar1 = (byte)((uint)c >> 0x12) | 0xf0;
        s8._2_2_ = (undefined2)(in_RAX >> 0x30);
        _uStack_18 = (undefined5)in_RAX;
        _uStack_18 = CONCAT26(s8._2_2_,CONCAT15((char)((uint)c >> 0xc),_uStack_18)) &
                     0xffff3fffffffffff | 0x800000000000;
        uVar3 = 2;
      }
      _uStack_18 = CONCAT14(bVar1,uStack_18);
      uVar2 = uVar3 + 1;
      s8[uVar3] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    }
    uVar3 = uVar2 + 1;
    s8[uVar2] = (byte)c & 0x3f | 0x80;
  }
  if (edits != (Edits *)0x0) {
    Edits::addReplace(edits,length,uVar3);
  }
  (*sink->_vptr_ByteSink[2])(sink,s8,(ulong)uVar3);
  return;
}

Assistant:

void
ByteSinkUtil::appendCodePoint(int32_t length, UChar32 c, ByteSink &sink, Edits *edits) {
    char s8[U8_MAX_LENGTH];
    int32_t s8Length = 0;
    U8_APPEND_UNSAFE(s8, s8Length, c);
    if (edits != nullptr) {
        edits->addReplace(length, s8Length);
    }
    sink.Append(s8, s8Length);
}